

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dds_comp.cpp
# Opt level: O2

bool __thiscall crnlib::dds_comp::convert_to_dxt(dds_comp *this,crn_comp_params *params)

{
  crn_uint32 cVar1;
  code *pcVar2;
  qdxt_state *state;
  bool bVar3;
  long lVar4;
  long lVar5;
  
  cVar1 = params->m_quality_level;
  if ((cVar1 == 0xff) || (params->m_format == cCRNFmtDXT3)) {
    mipmapped_texture::operator=(&this->m_packed_tex,&this->m_src_tex);
    bVar3 = mipmapped_texture::convert
                      (&this->m_packed_tex,this->m_pixel_fmt,false,&this->m_pack_params);
    if (!bVar3) {
      return false;
    }
LAB_00155646:
    bVar3 = true;
  }
  else {
    bVar3 = (bool)((byte)params->m_flags >> 1 & 1);
    (this->m_q1_params).m_quality_level = cVar1;
    (this->m_q1_params).m_hierarchical = bVar3;
    (this->m_q5_params).m_quality_level = cVar1;
    (this->m_q5_params).m_hierarchical = bVar3;
    if (this->m_pQDXT_state == (qdxt_state *)0x0) {
      state = crnlib_new<crnlib::mipmapped_texture::qdxt_state,crnlib::task_pool>
                        ((crnlib *)&this->m_task_pool,(task_pool *)params);
      this->m_pQDXT_state = state;
      if (params->m_pProgress_func != (crn_progress_callback_func)0x0) {
        (this->m_q1_params).m_pProgress_func = progress_callback_func_phase_0;
        (this->m_q1_params).m_pProgress_data = params;
        (this->m_q5_params).m_pProgress_func = progress_callback_func_phase_0;
        (this->m_q5_params).m_pProgress_data = params;
      }
      bVar3 = mipmapped_texture::qdxt_pack_init
                        (&this->m_src_tex,state,&this->m_packed_tex,&this->m_q1_params,
                         &this->m_q5_params,this->m_pixel_fmt,false);
      if (bVar3) {
        if (params->m_pProgress_func != (crn_progress_callback_func)0x0) {
          lVar4 = 0x1020;
          pcVar2 = progress_callback_func_phase_1;
          lVar5 = 0x9f8;
          params = (crn_comp_params *)progress_callback_func_phase_1;
          goto LAB_0015561d;
        }
        goto LAB_00155625;
      }
    }
    else {
      if (params->m_pProgress_func != (crn_progress_callback_func)0x0) {
        pcVar2 = progress_callback_func;
        (this->m_q1_params).m_pProgress_func = progress_callback_func;
        (this->m_q1_params).m_pProgress_data = params;
        lVar4 = 0x1028;
        lVar5 = 0x1020;
LAB_0015561d:
        *(code **)((long)&(this->super_itexture_comp)._vptr_itexture_comp + lVar5) = pcVar2;
        *(crn_comp_params **)((long)&(this->super_itexture_comp)._vptr_itexture_comp + lVar4) =
             params;
      }
LAB_00155625:
      bVar3 = mipmapped_texture::qdxt_pack
                        (&this->m_src_tex,this->m_pQDXT_state,&this->m_packed_tex,&this->m_q1_params
                         ,&this->m_q5_params);
      if (bVar3) goto LAB_00155646;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool dds_comp::convert_to_dxt(const crn_comp_params& params)
    {
        if ((params.m_quality_level == cCRNMaxQualityLevel) || (params.m_format == cCRNFmtDXT3))
        {
            m_packed_tex = m_src_tex;
            if (!m_packed_tex.convert(m_pixel_fmt, false, m_pack_params))
            {
                return false;
            }
        }
        else
        {
            const bool hierarchical = (params.m_flags & cCRNCompFlagHierarchical) != 0;

            m_q1_params.m_quality_level = params.m_quality_level;
            m_q1_params.m_hierarchical = hierarchical;

            m_q5_params.m_quality_level = params.m_quality_level;
            m_q5_params.m_hierarchical = hierarchical;

            if (!m_pQDXT_state)
            {
                m_pQDXT_state = crnlib_new<mipmapped_texture::qdxt_state>(m_task_pool);

                if (params.m_pProgress_func)
                {
                    m_q1_params.m_pProgress_func = progress_callback_func_phase_0;
                    m_q1_params.m_pProgress_data = (void*)&params;
                    m_q5_params.m_pProgress_func = progress_callback_func_phase_0;
                    m_q5_params.m_pProgress_data = (void*)&params;
                }

                if (!m_src_tex.qdxt_pack_init(*m_pQDXT_state, m_packed_tex, m_q1_params, m_q5_params, m_pixel_fmt, false))
                {
                    return false;
                }

                if (params.m_pProgress_func)
                {
                    m_q1_params.m_pProgress_func = progress_callback_func_phase_1;
                    m_q5_params.m_pProgress_func = progress_callback_func_phase_1;
                }
            }
            else
            {
                if (params.m_pProgress_func)
                {
                    m_q1_params.m_pProgress_func = progress_callback_func;
                    m_q1_params.m_pProgress_data = (void*)&params;
                    m_q5_params.m_pProgress_func = progress_callback_func;
                    m_q5_params.m_pProgress_data = (void*)&params;
                }
            }

            if (!m_src_tex.qdxt_pack(*m_pQDXT_state, m_packed_tex, m_q1_params, m_q5_params))
            {
                return false;
            }
        }

        return true;
    }